

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  long *plVar4;
  ostream *poVar5;
  size_t sVar6;
  long *plVar7;
  size_type *psVar8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  uint uVar10;
  char flag;
  Message error;
  char buffer [256];
  byte local_221;
  string local_220;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  int local_1bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  string local_158;
  string local_138 [8];
  
  do {
    sVar2 = read(this->read_fd_,&local_221,1);
    iVar1 = (int)sVar2;
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        this->outcome_ = DIED;
        goto LAB_00109970;
      }
      if (iVar1 == 1) {
        if (local_221 < 0x52) {
          if (local_221 == 0x49) {
            iVar1 = this->read_fd_;
            Message::Message((Message *)&local_200);
            do {
              while( true ) {
                sVar2 = read(iVar1,local_138,0xff);
                uVar10 = (uint)sVar2;
                if ((int)uVar10 < 1) break;
                *(undefined1 *)((long)&local_138[0]._M_dataplus._M_p + (ulong)(uVar10 & 0x7fffffff))
                     = 0;
                poVar5 = (ostream *)(local_200._M_head_impl + 0x10);
                sVar6 = strlen((char *)local_138);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_138,sVar6);
              }
            } while ((uVar10 == 0xffffffff) && (piVar3 = __errno_location(), *piVar3 == 4));
            if (uVar10 == 0) {
              GTestLog::GTestLog((GTestLog *)&local_1e0,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/LLNL[P]MPIDiff/tpl/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                                 ,0x16b);
              StringStreamToString(&local_220,local_200._M_head_impl);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_220._M_dataplus._M_p,local_220._M_string_length
                        );
            }
            else {
              piVar3 = __errno_location();
              iVar1 = *piVar3;
              GTestLog::GTestLog((GTestLog *)&local_1e0,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/LLNL[P]MPIDiff/tpl/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                                 ,0x16e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
              GetLastErrnoDescription_abi_cxx11_();
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_220._M_dataplus._M_p,
                                  local_220._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," [",2);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            GTestLog::~GTestLog((GTestLog *)&local_1e0);
            if (local_200._M_head_impl != (stringstream *)0x0) {
              (**(code **)(*(long *)local_200._M_head_impl + 8))();
            }
            goto LAB_00109970;
          }
          if (local_221 == 0x4c) {
            this->outcome_ = LIVED;
            goto LAB_00109970;
          }
        }
        else {
          if (local_221 == 0x54) {
            this->outcome_ = THREW;
            goto LAB_00109970;
          }
          if (local_221 == 0x52) {
            this->outcome_ = RETURNED;
            goto LAB_00109970;
          }
        }
        GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/LLNL[P]MPIDiff/tpl/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                           ,0x1ef);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Death test child process reported ",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unexpected status byte (",0x18);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        GTestLog::~GTestLog((GTestLog *)local_138);
        goto LAB_00109970;
      }
      break;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  GTestLog::GTestLog((GTestLog *)&local_220,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/LLNL[P]MPIDiff/tpl/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                     ,500);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_138[0]._M_dataplus._M_p,local_138[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_220);
LAB_00109970:
  do {
    iVar1 = close(this->read_fd_);
    if (iVar1 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"CHECK failed: File ","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_178);
  local_198 = (long *)*plVar4;
  plVar7 = plVar4 + 2;
  if (local_198 == plVar7) {
    local_188 = *plVar7;
    lStack_180 = plVar4[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *plVar7;
  }
  local_190 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_198);
  local_1b8._M_dataplus._M_p = (pointer)*plVar4;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_1b8._M_dataplus._M_p == psVar8) {
    local_1b8.field_2._M_allocated_capacity = *psVar8;
    local_1b8.field_2._8_8_ = plVar4[3];
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar8;
  }
  local_1b8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1bc = 0x1f7;
  StreamableToString<int>(&local_158,&local_1bc);
  std::operator+(&local_1e0,&local_1b8,&local_158);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  local_200._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar4;
  pbVar9 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar4 + 2);
  if (local_200._M_head_impl == pbVar9) {
    local_1f0 = *(long *)pbVar9;
    lStack_1e8 = plVar4[3];
    local_200._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f0;
  }
  else {
    local_1f0 = *(long *)pbVar9;
  }
  local_1f8 = plVar4[1];
  *plVar4 = (long)pbVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_200);
  local_220._M_dataplus._M_p = (pointer)*plVar4;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_220._M_dataplus._M_p == psVar8) {
    local_220.field_2._M_allocated_capacity = *psVar8;
    local_220.field_2._8_8_ = plVar4[3];
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar8;
  }
  local_220._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_220);
  local_138[0]._M_dataplus._M_p = (pointer)*plVar4;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_138[0]._M_dataplus._M_p == psVar8) {
    local_138[0].field_2._0_8_ = *psVar8;
    local_138[0].field_2._8_8_ = plVar4[3];
    local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
  }
  else {
    local_138[0].field_2._0_8_ = *psVar8;
  }
  local_138[0]._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  DeathTestAbort(local_138);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}